

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
GeneratedMessageReflection_UnvalidatedStringsAreDowngradedToBytes_Test::TestBody
          (GeneratedMessageReflection_UnvalidatedStringsAreDowngradedToBytes_Test *this)

{
  int number;
  undefined8 uVar1;
  string *this_00;
  ulong uVar2;
  Message *in_RCX;
  ulong uVar3;
  InternalMetadata arena;
  string_view input;
  TestChildExtension msg;
  TestChildExtension parsed_msg;
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  TestChildExtension local_a0;
  long *local_70 [2];
  long local_60 [2];
  TestChildExtension local_50;
  
  proto2_unittest::TestChildExtension::TestChildExtension(&local_50,(Arena *)0x0);
  input._M_str = (char *)&local_50;
  input._M_len = (size_t)
                 "\n        optional_extension <\n          [proto2_unittest.repeated_string_extension]: \"foo\"\n        >\n      "
  ;
  TextFormat::ParseFromString((TextFormat *)0x6b,input,in_RCX);
  proto2_unittest::TestChildExtension::TestChildExtension(&local_a0,(Arena *)0x0);
  local_a0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_a0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 4;
  if (local_a0.field_0._impl_.optional_extension_ == (TestAllExtensions *)0x0) {
    arena.ptr_ = local_a0.super_Message.super_MessageLite._internal_metadata_.ptr_;
    if ((local_a0.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      arena.ptr_ = *(undefined8 *)
                    (local_a0.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                    0xfffffffffffffffe);
    }
    local_a0.field_0._impl_.optional_extension_ =
         (TestAllExtensions *)
         Arena::DefaultConstruct<proto2_unittest::TestAllExtensions>((Arena *)arena.ptr_);
  }
  uVar1 = local_a0.field_0._impl_.optional_extension_;
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"bar","");
  number = proto2_unittest::repeated_string_extension;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,local_c0,local_b8 + (long)local_c0);
  this_00 = protobuf::internal::ExtensionSet::AddString_abi_cxx11_
                      (&(((TestAllExtensions *)uVar1)->field_0)._impl_._extensions_,number,'\f',
                       (FieldDescriptor *)0x0);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  local_50.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_50.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 4;
  if (local_50.field_0._impl_.optional_extension_ == (TestAllExtensions *)0x0) {
    if ((local_50.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      local_50.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           *(undefined8 *)
            (local_50.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe)
      ;
    }
    local_50.field_0._impl_.optional_extension_ =
         (TestAllExtensions *)
         Arena::DefaultConstruct<proto2_unittest::TestAllExtensions>
                   ((Arena *)local_50.super_Message.super_MessageLite._internal_metadata_.ptr_);
  }
  uVar1 = local_50.field_0._impl_.optional_extension_;
  local_a0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_a0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 4;
  if (local_a0.field_0._impl_.optional_extension_ == (TestAllExtensions *)0x0) {
    if ((local_a0.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      local_a0.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           *(undefined8 *)
            (local_a0.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe)
      ;
    }
    local_a0.field_0._impl_.optional_extension_ =
         (TestAllExtensions *)
         Arena::DefaultConstruct<proto2_unittest::TestAllExtensions>
                   ((Arena *)local_a0.super_Message.super_MessageLite._internal_metadata_.ptr_);
  }
  if (local_a0.field_0._impl_.optional_extension_ != (TestAllExtensions *)uVar1) {
    uVar2 = (((TestAllExtensions *)uVar1)->super_Message).super_MessageLite._internal_metadata_.ptr_
    ;
    if ((uVar2 & 1) != 0) {
      uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
    }
    uVar3 = ((local_a0.field_0._impl_.optional_extension_)->super_Message).super_MessageLite.
            _internal_metadata_.ptr_;
    if ((uVar3 & 1) != 0) {
      uVar3 = *(ulong *)(uVar3 & 0xfffffffffffffffe);
    }
    if (uVar2 == uVar3) {
      proto2_unittest::TestAllExtensions::InternalSwap
                ((TestAllExtensions *)uVar1,local_a0.field_0._impl_.optional_extension_);
    }
    else {
      protobuf::internal::GenericSwap
                ((Message *)uVar1,&(local_a0.field_0._impl_.optional_extension_)->super_Message);
    }
  }
  proto2_unittest::TestChildExtension::~TestChildExtension(&local_a0);
  proto2_unittest::TestChildExtension::~TestChildExtension(&local_50);
  return;
}

Assistant:

TEST(GeneratedMessageReflection, UnvalidatedStringsAreDowngradedToBytes) {
  proto2_unittest::TestChildExtension parsed_msg;
  google::protobuf::TextFormat::ParseFromString(
      R"pb(
        optional_extension <
          [proto2_unittest.repeated_string_extension]: "foo"
        >
      )pb",
      &parsed_msg);
  proto2_unittest::TestChildExtension msg;
  msg.mutable_optional_extension()->AddExtension(
      proto2_unittest::repeated_string_extension, "bar");
  parsed_msg.mutable_optional_extension()->Swap(
      msg.mutable_optional_extension());
}